

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaANCF_3843::ComputeInternalJacobianPreInt
          (ChElementHexaANCF_3843 *this,ChMatrixRef *H,double Kfactor,double Rfactor,double Mfactor)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  PointerType pdVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ChElementHexaANCF_3843 *pCVar12;
  ulong uVar13;
  undefined8 *puVar14;
  char *__function;
  long lVar15;
  undefined8 *puVar16;
  int iVar17;
  undefined8 *puVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  double *pdVar23;
  long lVar24;
  Index outer;
  long lVar25;
  undefined8 *puVar26;
  long lVar27;
  long lVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined8 in_XMM0_Qb;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined8 in_XMM1_Qb;
  Matrix<double,__1,__1,_0,__1,__1> K2;
  DstEvaluatorType dstEvaluator;
  ChMatrixNM<double,_1,_NSF> tempRow2;
  ChMatrixNM<double,_1,_NSF> tempRow1;
  ChMatrixNM<double,_1,_NSF> tempRow0;
  Matrix3xN e_bar;
  MatrixNxN K_K13Compact;
  Matrix3xN e_bar_dot;
  ChVectorN<double,_(NSF_*_(NSF___1))___2> ScaledMassMatrix;
  ChMatrixNMc<double,_9,_NSF_*_NSF> PI2;
  assign_op<double,_double> aStack_15a99;
  long lStack_15a98;
  ulong uStack_15a90;
  undefined8 *puStack_15a88;
  ChElementHexaANCF_3843 *pCStack_15a80;
  long lStack_15a78;
  double dStack_15a70;
  undefined8 uStack_15a68;
  DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_9,_1024,_0,_9,_1024>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
  *pDStack_15a60;
  undefined8 uStack_15a58;
  double dStack_15a50;
  long lStack_15a40;
  long lStack_15a38;
  long lStack_15a30;
  plainobjectbase_evaluator_data<double,_32> pStack_15a28;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_32,_32,_1,_32,_32>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  gStack_15a20;
  undefined1 auStack_15a00 [64];
  undefined1 auStack_159c0 [64];
  undefined1 auStack_15980 [64];
  undefined1 auStack_15940 [64];
  undefined1 auStack_15900 [64];
  undefined1 auStack_158c0 [64];
  undefined1 auStack_15880 [64];
  undefined1 auStack_15840 [64];
  undefined1 auStack_15800 [64];
  undefined1 auStack_157c0 [64];
  undefined1 auStack_15780 [64];
  undefined1 auStack_15740 [64];
  undefined1 auStack_15700 [128];
  undefined1 auStack_15680 [64];
  undefined1 auStack_15640 [64];
  undefined1 auStack_15600 [64];
  undefined1 auStack_155c0 [64];
  undefined1 auStack_15580 [64];
  undefined1 auStack_15540 [64];
  undefined1 auStack_15500 [64];
  undefined1 auStack_154c0 [64];
  undefined1 auStack_15480 [64];
  undefined1 auStack_15440 [64];
  DstXprType DStack_15400;
  undefined1 auStack_13400 [64];
  undefined1 auStack_133c0 [64];
  undefined1 auStack_13380 [64];
  undefined1 auStack_13340 [64];
  undefined1 auStack_13300 [64];
  undefined1 auStack_132c0 [64];
  undefined1 auStack_13280 [64];
  undefined1 auStack_13240 [64];
  undefined1 auStack_13200 [64];
  undefined1 auStack_131c0 [64];
  undefined1 auStack_13180 [64];
  undefined1 auStack_13140 [64];
  SrcEvaluatorType SStack_13100;
  undefined1 auStack_130c0 [4160];
  undefined1 auStack_12080 [16];
  undefined8 auStack_12070 [3];
  undefined8 auStack_12058 [3];
  undefined8 auStack_12040 [9218];
  
  dStack_15a70 = Kfactor;
  uStack_15a68 = in_XMM0_Qb;
  pDStack_15a60 =
       (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_9,_1024,_0,_9,_1024>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
        *)Rfactor;
  uStack_15a58 = in_XMM1_Qb;
  dStack_15a50 = Mfactor;
  CalcCoordMatrix(this,(Matrix3xN *)auStack_15700);
  CalcCoordDerivMatrix(this,(Matrix3xN *)auStack_13400);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = this->m_Alpha;
  auVar11._8_8_ = uStack_15a58;
  auVar11._0_8_ = pDStack_15a60;
  auVar29._8_8_ = uStack_15a68;
  auVar29._0_8_ = dStack_15a70;
  auVar29 = vfmadd213sd_fma(auVar11,auVar34,auVar29);
  auVar30 = vbroadcastsd_avx512f(auVar29);
  auVar31 = vmulpd_avx512f(auVar30,auStack_15700._0_64_);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = this->m_Alpha * dStack_15a70;
  auVar32 = vbroadcastsd_avx512f(auVar35);
  auVar33 = vmulpd_avx512f(auVar32,auStack_13400);
  auStack_15800 = vaddpd_avx512f(auVar31,auVar33);
  auVar31 = vmulpd_avx512f(auVar30,auStack_15700._64_64_);
  auVar33 = vmulpd_avx512f(auVar32,auStack_133c0);
  auStack_157c0 = vaddpd_avx512f(auVar31,auVar33);
  auVar31 = vmulpd_avx512f(auVar30,auStack_15680);
  auVar33 = vmulpd_avx512f(auVar32,auStack_13380);
  auStack_15780 = vaddpd_avx512f(auVar31,auVar33);
  auVar31 = vmulpd_avx512f(auVar30,auStack_15640);
  auVar33 = vmulpd_avx512f(auVar32,auStack_13340);
  auStack_15740 = vaddpd_avx512f(auVar31,auVar33);
  auVar31 = vmulpd_avx512f(auVar30,auStack_15600);
  auVar33 = vmulpd_avx512f(auVar32,auStack_13300);
  auStack_15900 = vaddpd_avx512f(auVar31,auVar33);
  auVar31 = vmulpd_avx512f(auVar30,auStack_155c0);
  auVar33 = vmulpd_avx512f(auVar32,auStack_132c0);
  auStack_158c0 = vaddpd_avx512f(auVar31,auVar33);
  auVar31 = vmulpd_avx512f(auVar30,auStack_15580);
  auVar33 = vmulpd_avx512f(auVar32,auStack_13280);
  auStack_15880 = vaddpd_avx512f(auVar31,auVar33);
  auVar31 = vmulpd_avx512f(auVar30,auStack_15540);
  auVar33 = vmulpd_avx512f(auVar32,auStack_13240);
  auStack_15840 = vaddpd_avx512f(auVar31,auVar33);
  auVar31 = vmulpd_avx512f(auVar30,auStack_15500);
  auVar33 = vmulpd_avx512f(auVar32,auStack_13200);
  auStack_15a00 = vaddpd_avx512f(auVar31,auVar33);
  auVar31 = vmulpd_avx512f(auVar30,auStack_154c0);
  auVar33 = vmulpd_avx512f(auVar32,auStack_131c0);
  auStack_159c0 = vaddpd_avx512f(auVar31,auVar33);
  auVar31 = vmulpd_avx512f(auVar30,auStack_15480);
  auVar33 = vmulpd_avx512f(auVar32,auStack_13180);
  auStack_15980 = vaddpd_avx512f(auVar31,auVar33);
  auVar30 = vmulpd_avx512f(auVar30,auStack_15440);
  auVar31 = vmulpd_avx512f(auVar32,auStack_13140);
  auStack_15940 = vaddpd_avx512f(auVar30,auVar31);
  puVar14 = auStack_12070;
  puVar16 = auStack_12058;
  puVar18 = auStack_12040;
  lVar21 = 0;
  do {
    dVar1 = *(double *)(auStack_15700 + lVar21 * 8);
    dVar2 = *(double *)(auStack_15600 + lVar21 * 8);
    dVar3 = *(double *)(auStack_15500 + lVar21 * 8);
    lVar25 = 0;
    pdVar23 = DStack_15400.super_PlainObjectBase<Eigen::Matrix<double,_32,_32,_1,_32,_32>_>.
              m_storage.m_data.array + 2;
    do {
      dVar4 = *(double *)(auStack_15800 + lVar25 * 8);
      ((plain_array<double,_1024,_1,_64> *)(pdVar23 + -2))->array[0] = dVar1 * dVar4;
      pdVar23[-1] = dVar2 * dVar4;
      *pdVar23 = dVar3 * dVar4;
      lVar25 = lVar25 + 1;
      pdVar23 = pdVar23 + 3;
    } while (lVar25 != 0x20);
    lVar25 = 0x10;
    puVar26 = puVar14;
    do {
      uVar9 = *(undefined8 *)(auStack_15440 + lVar25 + 0x38);
      puVar26[-2] = *(undefined8 *)(auStack_15440 + lVar25 + 0x30);
      puVar26[-1] = uVar9;
      *puVar26 = *(undefined8 *)
                  ((long)DStack_15400.
                         super_PlainObjectBase<Eigen::Matrix<double,_32,_32,_1,_32,_32>_>.m_storage.
                         m_data.array + lVar25);
      lVar25 = lVar25 + 0x18;
      puVar26 = puVar26 + 9;
    } while (lVar25 != 0x310);
    lVar25 = 0;
    pdVar23 = DStack_15400.super_PlainObjectBase<Eigen::Matrix<double,_32,_32,_1,_32,_32>_>.
              m_storage.m_data.array + 2;
    do {
      dVar4 = *(double *)(auStack_15900 + lVar25 * 8);
      ((plain_array<double,_1024,_1,_64> *)(pdVar23 + -2))->array[0] = dVar1 * dVar4;
      pdVar23[-1] = dVar2 * dVar4;
      *pdVar23 = dVar3 * dVar4;
      lVar25 = lVar25 + 1;
      pdVar23 = pdVar23 + 3;
    } while (lVar25 != 0x20);
    lVar25 = 0x10;
    puVar26 = puVar16;
    do {
      uVar9 = *(undefined8 *)(auStack_15440 + lVar25 + 0x38);
      puVar26[-2] = *(undefined8 *)(auStack_15440 + lVar25 + 0x30);
      puVar26[-1] = uVar9;
      *puVar26 = *(undefined8 *)
                  ((long)DStack_15400.
                         super_PlainObjectBase<Eigen::Matrix<double,_32,_32,_1,_32,_32>_>.m_storage.
                         m_data.array + lVar25);
      lVar25 = lVar25 + 0x18;
      puVar26 = puVar26 + 9;
    } while (lVar25 != 0x310);
    lVar25 = 0;
    pdVar23 = DStack_15400.super_PlainObjectBase<Eigen::Matrix<double,_32,_32,_1,_32,_32>_>.
              m_storage.m_data.array + 2;
    do {
      dVar4 = *(double *)(auStack_15a00 + lVar25 * 8);
      ((plain_array<double,_1024,_1,_64> *)(pdVar23 + -2))->array[0] = dVar1 * dVar4;
      pdVar23[-1] = dVar2 * dVar4;
      *pdVar23 = dVar3 * dVar4;
      lVar25 = lVar25 + 1;
      pdVar23 = pdVar23 + 3;
    } while (lVar25 != 0x20);
    lVar25 = 0x10;
    puVar26 = puVar18;
    do {
      uVar9 = *(undefined8 *)(auStack_15440 + lVar25 + 0x38);
      puVar26[-2] = *(undefined8 *)(auStack_15440 + lVar25 + 0x30);
      puVar26[-1] = uVar9;
      *puVar26 = *(undefined8 *)
                  ((long)DStack_15400.
                         super_PlainObjectBase<Eigen::Matrix<double,_32,_32,_1,_32,_32>_>.m_storage.
                         m_data.array + lVar25);
      lVar25 = lVar25 + 0x18;
      puVar26 = puVar26 + 9;
    } while (lVar25 != 0x310);
    lVar21 = lVar21 + 1;
    puVar14 = puVar14 + 0x120;
    puVar16 = puVar16 + 0x120;
    puVar18 = puVar18 + 0x120;
  } while (lVar21 != 0x20);
  DStack_15400.super_PlainObjectBase<Eigen::Matrix<double,_32,_32,_1,_32,_32>_>.m_storage.m_data.
  array[2] = (double)&this->m_O2;
  DStack_15400.super_PlainObjectBase<Eigen::Matrix<double,_32,_32,_1,_32,_32>_>.m_storage.m_data.
  array[0] = (double)auStack_12080;
  pCStack_15a80 = this;
  if ((this->m_O2).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
      != 0x400) {
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                  "Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, 9, 1024, 0>>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, 9, 1024, 0>>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
                 );
  }
  pDStack_15a60 =
       (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_9,_1024,_0,_9,_1024>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
        *)&DStack_15400;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,9,1024,0,9,1024>const>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&lStack_15a40,pDStack_15a60);
  pCVar12 = pCStack_15a80;
  puStack_15a88 = (undefined8 *)(lStack_15a40 + 0x40);
  lStack_15a78 = lStack_15a38 * 8;
  uStack_15a90 = 8;
  lStack_15a98 = 0x10;
  lVar25 = 0;
  lVar21 = 0;
  do {
    if (lStack_15a38 < 3) {
LAB_0071446a:
      __function = 
      "Eigen::Block<Eigen::Matrix<double, -1, -1>, 3, 1>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
      ;
LAB_00714496:
      __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,__function);
    }
    pdVar6 = (H->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
             .
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_data;
    lVar7 = (H->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_rows.m_value;
    lVar27 = (H->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).m_stride.m_outer.m_value;
    lVar15 = lVar27 * lVar25;
    lVar24 = lVar27 * uStack_15a90;
    lVar27 = lVar27 * lStack_15a98;
    lVar28 = 2;
    puVar14 = puStack_15a88;
    lVar22 = lVar21;
    do {
      if (lStack_15a30 <= lVar22) goto LAB_0071446a;
      if ((lVar7 < lVar21 * 3 + 3) ||
         ((H->
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value <= lVar28 + -2)) {
LAB_00714481:
        __function = 
        "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 3, 1>::Block(XprType &, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
        ;
        goto LAB_00714496;
      }
      *(undefined8 *)((long)pdVar6 + lVar28 * 8 + lVar15 + -0x10) = puVar14[-8];
      *(undefined8 *)((long)pdVar6 + lVar28 * 8 + lVar24 + -0x10) = puVar14[-7];
      *(undefined8 *)((long)pdVar6 + lVar28 * 8 + lVar27 + -0x10) = puVar14[-6];
      if ((lStack_15a38 < 6) || (lStack_15a30 <= lVar22)) goto LAB_0071446a;
      if ((H->
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value <= lVar28 + -1) goto LAB_00714481;
      *(undefined8 *)((long)pdVar6 + lVar28 * 8 + lVar15 + -8) = puVar14[-5];
      *(undefined8 *)((long)pdVar6 + lVar28 * 8 + lVar24 + -8) = puVar14[-4];
      *(undefined8 *)((long)pdVar6 + lVar28 * 8 + lVar27 + -8) = puVar14[-3];
      if ((lStack_15a38 < 9) || (lStack_15a30 <= lVar22)) goto LAB_0071446a;
      if ((H->
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value <= lVar28) goto LAB_00714481;
      *(undefined8 *)((long)pdVar6 + lVar28 * 8 + lVar15) = puVar14[-2];
      *(undefined8 *)((long)pdVar6 + lVar28 * 8 + lVar24) = puVar14[-1];
      *(undefined8 *)((long)pdVar6 + lVar28 * 8 + lVar27) = *puVar14;
      lVar28 = lVar28 + 3;
      puVar14 = puVar14 + lStack_15a38 * 0x20;
      lVar22 = lVar22 + 0x20;
    } while (lVar28 != 0x62);
    lVar21 = lVar21 + 1;
    lVar25 = lVar25 + 0x18;
    uStack_15a90 = uStack_15a90 + 0x18;
    lStack_15a98 = lStack_15a98 + 0x18;
    puStack_15a88 = puStack_15a88 + lStack_15a38;
  } while (lVar21 != 0x20);
  SStack_13100.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
  m_outerStride =
       (pCStack_15a80->m_K13Compact).
       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
  uVar13 = (pCStack_15a80->m_K13Compact).
           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
  if ((long)(uVar13 | SStack_13100.
                      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                      .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      .m_d.m_outerStride) < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1>]"
                 );
  }
  if ((SStack_13100.
       super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
       .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
       super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
       m_outerStride != 0x20) || (uVar13 != 0x20)) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, 32, 32, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 32, 32, 1>]"
                 );
  }
  auVar10._8_8_ = uStack_15a68;
  auVar10._0_8_ = dStack_15a70;
  auVar8._8_8_ = 0x8000000000000000;
  auVar8._0_8_ = 0x8000000000000000;
  auVar29 = vxorpd_avx512vl(auVar10,auVar8);
  gStack_15a20.m_src = &SStack_13100;
  SStack_13100.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  .m_d.lhsImpl.
  super_evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  .m_functor.m_other = auVar29._0_8_;
  SStack_13100.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.data =
       (pCStack_15a80->m_K13Compact).
       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
  gStack_15a20.m_dst = (DstEvaluatorType *)&pStack_15a28;
  pStack_15a28.data = (double *)&DStack_15400;
  gStack_15a20.m_functor = &aStack_15a99;
  gStack_15a20.m_dstExpr = (DstXprType *)pStack_15a28.data;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_32,_32,_1,_32,_32>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_1>
  ::run(&gStack_15a20);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = dStack_15a50;
  auVar30 = vbroadcastsd_avx512f(auVar5);
  uVar13 = 0xfffffffffffffff8;
  do {
    auVar31 = vmulpd_avx512f(auVar30,*(undefined1 (*) [64])
                                      ((pCVar12->m_MassMatrix).
                                       super_PlainObjectBase<Eigen::Matrix<double,_528,_1,_0,_528,_1>_>
                                       .m_storage.m_data.array + uVar13 + 8));
    *(undefined1 (*) [64])(auStack_130c0 + uVar13 * 8) = auVar31;
    uVar13 = uVar13 + 8;
  } while (uVar13 < 0x208);
  uVar19 = 0;
  lVar21 = 0x10;
  lVar25 = -0xffffffc2;
  uVar13 = 0x2000000000;
  lVar7 = 8;
  lVar27 = 0;
  do {
    dStack_15a50 = (double)lVar27;
    lStack_15a78 = lVar7;
    pCStack_15a80 = (ChElementHexaANCF_3843 *)uVar13;
    dStack_15a70 = (double)lVar25;
    lStack_15a98 = lVar21;
    uStack_15a90 = (ulong)pCStack_15a80 >> 1 & 0x7fffffff;
    puStack_15a88 = (undefined8 *)(uVar19 * 3);
    pdVar6 = (H->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
             .
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_data;
    lVar21 = (H->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
             .
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_rows.m_value;
    lVar25 = (H->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
             .
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_cols.m_value;
    lVar7 = (H->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).m_stride.m_outer.m_value;
    iVar17 = 0x20;
    lVar27 = 2;
    uVar13 = 0;
    do {
      if (uVar13 < uVar19) {
        uVar20 = (((int)uVar13 + -0x1f) * iVar17 + 0x3e0U >> 1) + (int)uVar19;
      }
      else {
        uVar20 = (int)uStack_15a90 + (int)uVar13;
      }
      if (0x20f < uVar20) {
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, 528, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, 528, 1>, Level = 1]"
                     );
      }
      if ((lVar21 <= (long)puStack_15a88) || (lVar25 <= lVar27 + -2)) {
LAB_007144a0:
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 1>::operator()(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 1]"
                     );
      }
      dVar1 = *(double *)
               (&SStack_13100.
                 super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                 .m_d.field_0x0 + (ulong)uVar20 * 8) + *(double *)(pDStack_15a60 + uVar13 * 8);
      *(double *)((long)pdVar6 + lVar27 * 8 + lVar7 * (long)dStack_15a50 + -0x10) =
           dVar1 + *(double *)((long)pdVar6 + lVar27 * 8 + lVar7 * (long)dStack_15a50 + -0x10);
      if ((lVar21 <= (long)(uVar19 * 3 + 1)) ||
         (((lVar25 <= lVar27 + -1 ||
           (*(double *)((long)pdVar6 + lVar27 * 8 + lVar7 * lStack_15a78 + -8) =
                 dVar1 + *(double *)((long)pdVar6 + lVar27 * 8 + lVar7 * lStack_15a78 + -8),
           lVar21 <= (long)(uVar19 * 3 + 2))) || (lVar25 <= lVar27)))) goto LAB_007144a0;
      *(double *)((long)pdVar6 + lVar27 * 8 + lVar7 * lStack_15a98) =
           dVar1 + *(double *)((long)pdVar6 + lVar27 * 8 + lVar7 * lStack_15a98);
      uVar13 = uVar13 + 1;
      iVar17 = iVar17 + -1;
      lVar27 = lVar27 + 3;
    } while (lVar27 != 0x62);
    uVar19 = uVar19 + 1;
    pDStack_15a60 = pDStack_15a60 + 0x100;
    lVar21 = lStack_15a98 + 0x18;
    lVar25 = (long)dStack_15a70 + -2;
    uVar13 = (long)pCStack_15a80 + (long)dStack_15a70;
    lVar7 = lStack_15a78 + 0x18;
    lVar27 = (long)dStack_15a50 + 0x18;
    if (uVar19 == 0x20) {
      if (lStack_15a40 != 0) {
        free(*(void **)(lStack_15a40 + -8));
      }
      return;
    }
  } while( true );
}

Assistant:

void ChElementHexaANCF_3843::ComputeInternalJacobianPreInt(ChMatrixRef& H,
                                                           double Kfactor,
                                                           double Rfactor,
                                                           double Mfactor) {
    // Calculate the Jacobian of the generalize internal force vector using the "Pre-Integration" style of method
    // assuming a linear viscoelastic material model (single term damping model).  For this style of method, the
    // components of the generalized internal force vector and its Jacobian that need to be integrated across the volume
    // are calculated once prior to the start of the simulation.  For this method, the in-simulation calculations are
    // independent of the number of Gauss quadrature points used throughout the entire element.  Since computationally
    // expensive quantities are required for both the generalized internal force vector and its Jacobian, these values
    // were cached for reuse during this Jacobian calculation.

    Matrix3xN e_bar;
    Matrix3xN e_bar_dot;

    CalcCoordMatrix(e_bar);
    CalcCoordDerivMatrix(e_bar_dot);

    // Build the [9 x NSF^2] matrix containing the combined scaled nodal coordinates and their time derivatives.
    Matrix3xN temp = (Kfactor + m_Alpha * Rfactor) * e_bar + (m_Alpha * Kfactor) * e_bar_dot;
    ChMatrixNM<double, 1, NSF> tempRow0 = temp.template block<1, NSF>(0, 0);
    ChMatrixNM<double, 1, NSF> tempRow1 = temp.template block<1, NSF>(1, 0);
    ChMatrixNM<double, 1, NSF> tempRow2 = temp.template block<1, NSF>(2, 0);
    ChMatrixNMc<double, 9, NSF * NSF> PI2;

    for (unsigned int v = 0; v < NSF; v++) {
        PI2.template block<3, NSF>(0, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow0;
        PI2.template block<3, NSF>(3, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow1;
        PI2.template block<3, NSF>(6, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow2;
    }

    // Calculate the matrix containing the dense part of the Jacobian matrix in a reordered form. This is then reordered
    // from its [9 x NSF^2] form into its required [3*NSF x 3*NSF] form
    Eigen::Matrix<double, Eigen::Dynamic, Eigen::Dynamic, Eigen::ColMajor> K2 = -PI2 * m_O2;

    for (unsigned int k = 0; k < NSF; k++) {
        for (unsigned int f = 0; f < NSF; f++) {
            H.block<3, 1>(3 * k, 3 * f) = K2.template block<3, 1>(0, NSF * f + k);
            H.block<3, 1>(3 * k, 3 * f + 1) = K2.template block<3, 1>(3, NSF * f + k);
            H.block<3, 1>(3 * k, 3 * f + 2) = K2.template block<3, 1>(6, NSF * f + k);
        }
    }

    // Add in the sparse (blocks times the 3x3 identity matrix) component of the Jacobian that was already calculated as
    // part of the generalized internal force calculations as well as the Mass Matrix which is stored in compact upper
    // triangular form
    MatrixNxN K_K13Compact = -Kfactor * m_K13Compact;
    ChVectorN<double, (NSF * (NSF + 1)) / 2> ScaledMassMatrix = Mfactor * m_MassMatrix;

    for (unsigned int i = 0; i < NSF; i++) {
        for (unsigned int j = 0; j < NSF; j++) {
            unsigned int idx;
            // Convert from a (i,j) index to a linear index into the Mass Matrix in Compact Upper Triangular Form
            // https://math.stackexchange.com/questions/2134011/conversion-of-upper-triangle-linear-index-from-index-on-symmetrical-array
            if (j >= i) {
                idx = (NSF * (NSF - 1) - (NSF - i) * (NSF - i - 1)) / 2 + j;
            } else {
                idx = (NSF * (NSF - 1) - (NSF - j) * (NSF - j - 1)) / 2 + i;
            }

            double d = ScaledMassMatrix(idx) + K_K13Compact(i, j);
            H(3 * i, 3 * j) += d;
            H(3 * i + 1, 3 * j + 1) += d;
            H(3 * i + 2, 3 * j + 2) += d;
        }
    }
}